

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_Hatch::ReplaceLoops(ON_Hatch *this,ON_SimpleArray<const_ON_Curve_*> *loop_curves)

{
  int iVar1;
  uint uVar2;
  ON_Curve **ppOVar3;
  ON_Curve *pCurve2d;
  ON_HatchLoop *pOVar4;
  ON_HatchLoop **ppOVar5;
  size_t sz;
  void *pvVar6;
  int local_300;
  uint local_2fc;
  int i_3;
  int i_2;
  ON_HatchLoop *pOStack_2f0;
  int i_1;
  ON_HatchLoop *loop;
  undefined1 auStack_268 [8];
  ON_Plane hplane;
  ON_Xform flatxf;
  ON_Xform planexf;
  ON_Curve *p2d;
  uint local_cc;
  undefined1 local_c8 [4];
  int i;
  ON_SimpleArray<ON_HatchLoop_*> loops;
  undefined1 local_a8 [7];
  bool flat;
  ON_Xform xf;
  bool rc;
  ON_SimpleArray<const_ON_Curve_*> *loop_curves_local;
  ON_Hatch *this_local;
  
  iVar1 = ON_SimpleArray<const_ON_Curve_*>::Count(loop_curves);
  if (iVar1 < 1) {
    this_local._7_1_ = false;
  }
  else {
    xf.m_xform[3][3]._7_1_ = 1;
    ON_Xform::ON_Xform((ON_Xform *)local_a8);
    loops.m_capacity._3_1_ = 0;
    ON_SimpleArray<ON_HatchLoop_*>::ON_SimpleArray((ON_SimpleArray<ON_HatchLoop_*> *)local_c8);
    for (local_cc = 0; iVar1 = ON_SimpleArray<const_ON_Curve_*>::Count(loop_curves),
        (int)local_cc < iVar1; local_cc = local_cc + 1) {
      ppOVar3 = ON_SimpleArray<const_ON_Curve_*>::operator[](loop_curves,local_cc);
      if (*ppOVar3 == (ON_Curve *)0x0) {
        xf.m_xform[3][3]._7_1_ = 0;
        break;
      }
      sz = (size_t)local_cc;
      ppOVar3 = ON_SimpleArray<const_ON_Curve_*>::operator[](loop_curves,local_cc);
      pCurve2d = ON_Curve::Duplicate(*ppOVar3);
      if (pCurve2d == (ON_Curve *)0x0) {
        xf.m_xform[3][3]._7_1_ = 0;
        break;
      }
      iVar1 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar1 == 3) {
        if ((loops.m_capacity._3_1_ & 1) == 0) {
          ON_Xform::ON_Xform((ON_Xform *)(flatxf.m_xform[3] + 3));
          ON_Xform::ON_Xform((ON_Xform *)&hplane.plane_equation.d);
          hplane.plane_equation.y = ON_xy_plane.plane_equation.z;
          hplane.plane_equation.z = ON_xy_plane.plane_equation.d;
          hplane.zaxis.z = ON_xy_plane.plane_equation.x;
          hplane.plane_equation.x = ON_xy_plane.plane_equation.y;
          hplane.zaxis.x = ON_xy_plane.zaxis.y;
          hplane.zaxis.y = ON_xy_plane.zaxis.z;
          hplane.yaxis.y = ON_xy_plane.yaxis.z;
          hplane.yaxis.z = ON_xy_plane.zaxis.x;
          hplane.xaxis.z = ON_xy_plane.yaxis.x;
          hplane.yaxis.x = ON_xy_plane.yaxis.y;
          hplane.xaxis.x = ON_xy_plane.xaxis.y;
          hplane.xaxis.y = ON_xy_plane.xaxis.z;
          hplane.origin.z = ON_xy_plane.xaxis.x;
          hplane.origin.y = (this->m_plane).origin.z;
          auStack_268 = (undefined1  [8])(this->m_plane).origin.x;
          hplane.origin.x = (this->m_plane).origin.y;
          ON_Xform::Rotation((ON_Xform *)(flatxf.m_xform[3] + 3),&this->m_plane,
                             (ON_Plane *)auStack_268);
          ON_Xform::PlanarProjection((ON_Xform *)&hplane.plane_equation.d,(ON_Plane *)auStack_268);
          ON_Xform::operator*((ON_Xform *)&loop,(ON_Xform *)&hplane.plane_equation.d,
                              (ON_Xform *)(flatxf.m_xform[3] + 3));
          memcpy(local_a8,&loop,0x80);
          loops.m_capacity._3_1_ = 1;
          ON_Plane::~ON_Plane((ON_Plane *)auStack_268);
        }
        uVar2 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                          (pCurve2d,local_a8);
        if ((uVar2 & 1) != 0) {
          sz = 2;
          uVar2 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])();
          if ((uVar2 & 1) != 0) goto LAB_0065a751;
        }
        if (pCurve2d != (ON_Curve *)0x0) {
          (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        xf.m_xform[3][3]._7_1_ = 0;
        break;
      }
LAB_0065a751:
      pOVar4 = (ON_HatchLoop *)ON_HatchLoop::operator_new((ON_HatchLoop *)0x10,sz);
      iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count((ON_SimpleArray<ON_HatchLoop_*> *)local_c8);
      ON_HatchLoop::ON_HatchLoop(pOVar4,pCurve2d,(uint)(iVar1 != 0));
      pOStack_2f0 = pOVar4;
      if (pOVar4 == (ON_HatchLoop *)0x0) {
        if (pCurve2d != (ON_Curve *)0x0) {
          (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
      }
      else {
        ON_SimpleArray<ON_HatchLoop_*>::Append
                  ((ON_SimpleArray<ON_HatchLoop_*> *)local_c8,&stack0xfffffffffffffd10);
      }
    }
    if ((xf.m_xform[3][3]._7_1_ & 1) == 0) {
      for (i_2 = 0; iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count
                                      ((ON_SimpleArray<ON_HatchLoop_*> *)local_c8), i_2 < iVar1;
          i_2 = i_2 + 1) {
        pvVar6 = (void *)(ulong)(uint)i_2;
        ppOVar5 = ON_SimpleArray<ON_HatchLoop_*>::operator[]
                            ((ON_SimpleArray<ON_HatchLoop_*> *)local_c8,i_2);
        pOVar4 = *ppOVar5;
        if (pOVar4 != (ON_HatchLoop *)0x0) {
          ON_HatchLoop::~ON_HatchLoop(pOVar4);
          ON_HatchLoop::operator_delete(pOVar4,pvVar6);
        }
      }
      ON_SimpleArray<ON_HatchLoop_*>::Empty((ON_SimpleArray<ON_HatchLoop_*> *)local_c8);
    }
    iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count((ON_SimpleArray<ON_HatchLoop_*> *)local_c8);
    if (iVar1 < 1) {
      this_local._7_1_ = false;
    }
    else {
      for (local_2fc = 0; iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops),
          (int)local_2fc < iVar1; local_2fc = local_2fc + 1) {
        pvVar6 = (void *)(ulong)local_2fc;
        ppOVar5 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,local_2fc);
        pOVar4 = *ppOVar5;
        if (pOVar4 != (ON_HatchLoop *)0x0) {
          ON_HatchLoop::~ON_HatchLoop(pOVar4);
          ON_HatchLoop::operator_delete(pOVar4,pvVar6);
        }
      }
      ON_SimpleArray<ON_HatchLoop_*>::Empty(&this->m_loops);
      for (local_300 = 0;
          iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count((ON_SimpleArray<ON_HatchLoop_*> *)local_c8),
          local_300 < iVar1; local_300 = local_300 + 1) {
        ppOVar5 = ON_SimpleArray<ON_HatchLoop_*>::operator[]
                            ((ON_SimpleArray<ON_HatchLoop_*> *)local_c8,local_300);
        ON_SimpleArray<ON_HatchLoop_*>::Append(&this->m_loops,ppOVar5);
      }
      this_local._7_1_ = true;
    }
    ON_SimpleArray<ON_HatchLoop_*>::~ON_SimpleArray((ON_SimpleArray<ON_HatchLoop_*> *)local_c8);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Hatch::ReplaceLoops(ON_SimpleArray<const ON_Curve*>& loop_curves)
{
  if(loop_curves.Count() < 1)
    return false;

  bool rc = true;
  ON_Xform xf;
  bool flat = false;
  ON_SimpleArray<ON_HatchLoop*> loops;

  for(int i = 0; i < loop_curves.Count(); i++)
  {
    if(loop_curves[i] == 0)
    {
      rc = false;
      break;
    }
    ON_Curve* p2d = loop_curves[i]->Duplicate();
    if(p2d == 0)
    {
      rc = false;
      break;
    }
    if(p2d->Dimension() == 3)
    {
      if(!flat)
      {
        ON_Xform planexf, flatxf;
        ON_Plane hplane(ON_xy_plane);
        hplane.origin = m_plane.origin;
        planexf.Rotation(m_plane, hplane);
        flatxf.PlanarProjection(hplane);
        xf = flatxf * planexf;
        flat = true;
      }
      if(!p2d->Transform(xf) ||
         !p2d->ChangeDimension(2))
      {
        delete p2d;
        rc = false;
        break;
      }
    }
    ON_HatchLoop* loop = new ON_HatchLoop(p2d,loops.Count()?ON_HatchLoop::ltInner:ON_HatchLoop::ltOuter);
    if(loop)
      loops.Append(loop);
    else
      delete p2d;
  }
  if(!rc)
  {
    for(int i = 0; i < loops.Count(); i++)
      delete loops[i];

    loops.Empty();
  }

  if(loops.Count() < 1)
    return false;

  for(int i = 0; i < m_loops.Count(); i++)
    delete m_loops[i];
  m_loops.Empty();
  for(int i = 0; i < loops.Count(); i++)
    m_loops.Append(loops[i]);
  return true;
}